

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void __thiscall
boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>
          (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *this,parameter_trie *p)

{
  this->px = p;
  (this->pn).pi_ = (sp_counted_base *)0x0;
  detail::
  sp_pointer_construct<boost::runtime::cla::rt_cla_detail::parameter_trie,boost::runtime::cla::rt_cla_detail::parameter_trie>
            (this,p,&this->pn);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }